

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O0

tuple<unsigned_int,_int> __thiscall binary::binUvarint(binary *this,Bytes *buf)

{
  ulong uVar1;
  size_type sVar2;
  byte *pbVar3;
  int local_40 [3];
  uint local_34;
  int local_30 [2];
  byte local_25;
  int local_24;
  int iStack_20;
  uchar b;
  int i;
  UInt s;
  UInt x;
  Bytes *buf_local;
  
  i = 0;
  iStack_20 = 0;
  local_24 = 0;
  _s = buf;
  buf_local = (Bytes *)this;
  while( true ) {
    uVar1 = (ulong)local_24;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(_s);
    if (sVar2 <= uVar1) {
      local_40[1] = 0;
      local_40[0] = 0;
      std::tuple<unsigned_int,_int>::tuple<int,_int,_true>
                ((tuple<unsigned_int,_int> *)this,local_40 + 1,local_40);
      return (tuple<unsigned_int,_int>)(_Tuple_impl<0UL,_unsigned_int,_int>)this;
    }
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(_s,(long)local_24);
    local_25 = *pbVar3;
    if (local_25 < 0x80) break;
    i = (local_25 & 0x7f) << ((byte)iStack_20 & 0x1f) | i;
    iStack_20 = iStack_20 + 7;
    local_24 = local_24 + 1;
  }
  if ((8 < local_24) && (1 < local_25)) {
    local_30[1] = 0;
    local_30[0] = -(local_24 + 1);
    std::tuple<unsigned_int,_int>::tuple<int,_int,_true>
              ((tuple<unsigned_int,_int> *)this,local_30 + 1,local_30);
    return (tuple<unsigned_int,_int>)(_Tuple_impl<0UL,_unsigned_int,_int>)this;
  }
  local_34 = i | (uint)local_25 << ((byte)iStack_20 & 0x1f);
  local_40[2] = local_24 + 1;
  std::tuple<unsigned_int,_int>::tuple<unsigned_int,_int,_true>
            ((tuple<unsigned_int,_int> *)this,&local_34,local_40 + 2);
  return (tuple<unsigned_int,_int>)(_Tuple_impl<0UL,_unsigned_int,_int>)this;
}

Assistant:

std::tuple<UInt, int> binUvarint(const Bytes &buf) {
	UInt x{};
	UInt s{};

	for (int i = 0; i < buf.size(); i++) {
		unsigned char b = buf.at(i);
		if (b < 0x80) {
			if (i >= 9 && b > 1) {
				return {0, -(i + 1)}; // overflow
			}
			return {x | UInt(b) << s, i + 1};
		}
		x |= UInt(b & 0x7f) << s;
		s += 7;
	}
	return {0, 0};
}